

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (string *__return_storage_ptr__,CompilerGLSL *this,string *op,SPIRType *imgtype,
          uint32_t tex)

{
  bool bVar1;
  char *pcVar2;
  CompilerError *pCVar3;
  SPIRType *pSVar4;
  char *ts_1;
  undefined4 in_register_00000084;
  char *local_2a0;
  char *local_290;
  byte local_269;
  byte local_20b;
  byte local_20a;
  byte local_209;
  string local_1e0;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined4 local_198;
  allocator local_191;
  string local_190 [8];
  string type_prefix;
  undefined1 local_168 [6];
  bool is_es_and_depth;
  allocator local_142;
  undefined1 local_141;
  string local_140;
  allocator local_119;
  string local_118;
  byte local_f2;
  allocator local_f1;
  undefined1 local_f0 [6];
  bool is_comparison;
  undefined1 local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_69;
  string local_68;
  SPIREntryPoint *local_48;
  SPIREntryPoint *execution;
  undefined1 auStack_38 [7];
  bool legacy_lod_ext;
  char *type;
  undefined1 auStack_28 [4];
  uint32_t tex_local;
  SPIRType *imgtype_local;
  string *op_local;
  CompilerGLSL *this_local;
  
  pSVar4 = (SPIRType *)&switchD_003a567b::switchdataD_004a5710;
  switch((imgtype->image).dim) {
  case Dim1D:
    if (((this->options).es & 1U) == 0) {
      local_20a = 0;
      if (((imgtype->image).arrayed & 1U) != 0) {
        local_20a = (this->options).es ^ 0xff;
      }
      _auStack_38 = "1D";
      pSVar4 = (SPIRType *)0x4a9270;
      if ((local_20a & 1) != 0) {
        _auStack_38 = "1DArray";
      }
    }
    else {
      local_209 = 0;
      if (((imgtype->image).arrayed & 1U) != 0) {
        local_209 = (this->options).es ^ 0xff;
      }
      _auStack_38 = "2D";
      pSVar4 = (SPIRType *)0x4a9287;
      if ((local_209 & 1) != 0) {
        _auStack_38 = "2DArray";
      }
    }
    break;
  case Dim2D:
    local_20b = 0;
    if (((imgtype->image).arrayed & 1U) != 0) {
      local_20b = (this->options).es ^ 0xff;
    }
    _auStack_38 = "2D";
    pSVar4 = (SPIRType *)0x4a9287;
    if ((local_20b & 1) != 0) {
      _auStack_38 = "2DArray";
    }
    break;
  case Dim3D:
    _auStack_38 = "3D";
    break;
  case DimCube:
    _auStack_38 = "Cube";
    break;
  case DimRect:
    _auStack_38 = "2DRect";
    break;
  case DimBuffer:
    _auStack_38 = "Buffer";
    break;
  case DimSubpassData:
    _auStack_38 = "2D";
    break;
  default:
    _auStack_38 = "";
    pSVar4 = imgtype;
  }
  execution._7_1_ = 0;
  type._4_4_ = tex;
  _auStack_28 = imgtype;
  imgtype_local = (SPIRType *)op;
  op_local = (string *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  local_48 = Compiler::get_entry_point(&this->super_Compiler);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureGrad");
  if (((bVar1) ||
      (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)imgtype_local,"textureProjGrad"), bVar1)) ||
     (((bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureLod"), bVar1 ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureProjLod"), bVar1)) &&
      (local_48->model != ExecutionModelVertex)))) {
    bVar1 = is_legacy_es(this);
    if (bVar1) {
      execution._7_1_ = 1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_68,"GL_EXT_shader_texture_lod",&local_69);
      require_extension_internal(this,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      bVar1 = is_legacy_desktop(this);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_a0,"GL_ARB_shader_texture_lod",&local_a1);
        require_extension_internal(this,&local_a0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
    }
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureLodOffset");
  if ((bVar1) ||
     (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )imgtype_local,"textureProjLodOffset"), bVar1)) {
    bVar1 = is_legacy_es(this);
    if (bVar1) {
      local_c9 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                (&local_c8,(spirv_cross *)imgtype_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed in legacy ES",(char (*) [26])pSVar4);
      CompilerError::CompilerError(pCVar3,&local_c8);
      local_c9 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_f0,"GL_EXT_gpu_shader4",&local_f1);
    require_extension_internal(this,(string *)local_f0);
    ::std::__cxx11::string::~string((string *)local_f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  local_f2 = Compiler::is_depth_image(&this->super_Compiler,(SPIRType *)_auStack_28,type._4_4_);
  if (((bool)local_f2) && (bVar1 = is_legacy_es(this), bVar1)) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              imgtype_local,"texture");
    if ((!bVar1) &&
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureProj"), !bVar1)) {
      local_141 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                (&local_140,(spirv_cross *)imgtype_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed on depth samplers in legacy ES",(char (*) [44])pSVar4);
      CompilerError::CompilerError(pCVar3,&local_140);
      local_141 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_118,"GL_EXT_shadow_samplers",&local_119);
    require_extension_internal(this,&local_118);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
    if (*(Dim *)(_auStack_28 + 0xfc) == DimCube) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"shadowCubeNV",&local_142);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_142);
      return __return_storage_ptr__;
    }
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureSize");
  if (bVar1) {
    bVar1 = is_legacy_es(this);
    if (bVar1) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"textureSize not supported in legacy ES");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((local_f2 & 1) != 0) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar3,"textureSize not supported on shadow sampler in legacy GLSL");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)local_168,"GL_EXT_gpu_shader4",
               (allocator *)(type_prefix.field_2._M_local_buf + 0xf));
    require_extension_internal(this,(string *)local_168);
    ::std::__cxx11::string::~string((string *)local_168);
    ::std::allocator<char>::~allocator((allocator<char> *)(type_prefix.field_2._M_local_buf + 0xf));
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"texelFetch");
  if ((bVar1) && (bVar1 = is_legacy_es(this), bVar1)) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"texelFetch not supported in legacy ES");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = is_legacy_es(this);
  local_269 = 0;
  if (bVar1) {
    local_269 = local_f2;
  }
  type_prefix.field_2._M_local_buf[0xe] = local_269 & 1;
  ts_1 = "shadow";
  pcVar2 = "texture";
  if ((local_f2 & 1) != 0) {
    pcVar2 = "shadow";
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_190,pcVar2,&local_191);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_191);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"texture");
  if (bVar1) {
    if ((type_prefix.field_2._M_local_buf[0xe] & 1U) == 0) {
      join<std::__cxx11::string&,char_const*&>
                (__return_storage_ptr__,(spirv_cross *)local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38,
                 (char **)ts_1);
    }
    else {
      join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38,
                 (char **)0x4adc55,(char (*) [4])CONCAT44(in_register_00000084,tex));
    }
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              imgtype_local,"textureLod");
    if (bVar1) {
      local_1a0 = "Lod";
      if ((execution._7_1_ & 1) != 0) {
        local_1a0 = "LodEXT";
      }
      join<std::__cxx11::string&,char_const*&,char_const*>
                (__return_storage_ptr__,(spirv_cross *)local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38,
                 &local_1a0,(char **)CONCAT44(in_register_00000084,tex));
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )imgtype_local,"textureProj");
      if (bVar1) {
        local_1a8 = "Proj";
        if ((type_prefix.field_2._M_local_buf[0xe] & 1U) != 0) {
          local_1a8 = "ProjEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  (__return_storage_ptr__,(spirv_cross *)local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38,
                   &local_1a8,(char **)CONCAT44(in_register_00000084,tex));
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureGrad");
        if (bVar1) {
          bVar1 = is_legacy_es(this);
          if (bVar1) {
            local_290 = "GradEXT";
          }
          else {
            bVar1 = is_legacy_desktop(this);
            local_290 = "Grad";
            if (bVar1) {
              local_290 = "GradARB";
            }
          }
          local_1b0 = local_290;
          join<std::__cxx11::string&,char_const*&,char_const*>
                    (__return_storage_ptr__,(spirv_cross *)local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38
                     ,&local_1b0,(char **)CONCAT44(in_register_00000084,tex));
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)imgtype_local,"textureProjLod");
          if (bVar1) {
            local_1b8 = "ProjLod";
            if ((execution._7_1_ & 1) != 0) {
              local_1b8 = "ProjLodEXT";
            }
            join<std::__cxx11::string&,char_const*&,char_const*>
                      (__return_storage_ptr__,(spirv_cross *)local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_38,&local_1b8,(char **)CONCAT44(in_register_00000084,tex));
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)imgtype_local,"textureLodOffset");
            if (bVar1) {
              join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                        (__return_storage_ptr__,(spirv_cross *)local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_38,(char **)0x4a8fd4,
                         (char (*) [10])CONCAT44(in_register_00000084,tex));
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)imgtype_local,"textureProjGrad");
              if (bVar1) {
                bVar1 = is_legacy_es(this);
                if (bVar1) {
                  local_2a0 = "ProjGradEXT";
                }
                else {
                  bVar1 = is_legacy_desktop(this);
                  local_2a0 = "ProjGrad";
                  if (bVar1) {
                    local_2a0 = "ProjGradARB";
                  }
                }
                local_1c0 = local_2a0;
                join<std::__cxx11::string&,char_const*&,char_const*>
                          (__return_storage_ptr__,(spirv_cross *)local_190,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_38,&local_1c0,(char **)CONCAT44(in_register_00000084,tex));
              }
              else {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)imgtype_local,"textureProjLodOffset");
                if (bVar1) {
                  join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                            (__return_storage_ptr__,(spirv_cross *)local_190,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_38,(char **)0x4a9034,
                             (char (*) [14])CONCAT44(in_register_00000084,tex));
                }
                else {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)imgtype_local,"textureSize");
                  if (bVar1) {
                    join<char_const(&)[12],char_const*&>
                              (__return_storage_ptr__,(spirv_cross *)"textureSize",
                               (char (*) [12])auStack_38,(char **)ts_1);
                  }
                  else {
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)imgtype_local,"texelFetch");
                    if (!bVar1) {
                      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
                      join<char_const(&)[32],std::__cxx11::string_const&>
                                (&local_1e0,(spirv_cross *)"Unsupported legacy texture op: ",
                                 (char (*) [32])imgtype_local,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)ts_1);
                      CompilerError::CompilerError(pCVar3,&local_1e0);
                      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
                    }
                    join<char_const(&)[11],char_const*&>
                              (__return_storage_ptr__,(spirv_cross *)"texelFetch",
                               (char (*) [11])auStack_38,(char **)ts_1);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_198 = 1;
  ::std::__cxx11::string::~string(local_190);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		// Force 2D path for ES.
		if (options.es)
			type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		else
			type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	// In legacy GLSL, an extension is required for textureLod in the fragment
	// shader or textureGrad anywhere.
	bool legacy_lod_ext = false;
	auto &execution = get_entry_point();
	if (op == "textureGrad" || op == "textureProjGrad" ||
	    ((op == "textureLod" || op == "textureProjLod") && execution.model != ExecutionModelVertex))
	{
		if (is_legacy_es())
		{
			legacy_lod_ext = true;
			require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	bool is_comparison = is_depth_image(imgtype, tex);
	if (is_comparison && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));

		if (imgtype.image.dim == spv::DimCube)
			return "shadowCubeNV";
	}

	if (op == "textureSize")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("textureSize not supported in legacy ES");
		if (is_comparison)
			SPIRV_CROSS_THROW("textureSize not supported on shadow sampler in legacy GLSL");
		require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (op == "texelFetch" && is_legacy_es())
		SPIRV_CROSS_THROW("texelFetch not supported in legacy ES");

	bool is_es_and_depth = is_legacy_es() && is_comparison;
	std::string type_prefix = is_comparison ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
		return join(type_prefix, type, legacy_lod_ext ? "LodEXT" : "Lod");
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
		return join(type_prefix, type, legacy_lod_ext ? "ProjLodEXT" : "ProjLod");
	else if (op == "textureLodOffset")
		return join(type_prefix, type, "LodOffset");
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
		return join(type_prefix, type, "ProjLodOffset");
	else if (op == "textureSize")
		return join("textureSize", type);
	else if (op == "texelFetch")
		return join("texelFetch", type);
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}